

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TomlProcessingFunctions.cpp
# Opt level: O1

Time helics::fileops::loadTomlTime(value *timeElement,time_units defaultUnits)

{
  utilities *this;
  string_view unitString;
  string_view unitString_00;
  time_units tVar1;
  Time TVar2;
  enable_if_t<detail::is_chrono_duration<duration<long,_ratio<1L,_1000000000L>_>_>::value,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  eVar3;
  enable_if_t<detail::is_exact_toml_type<basic_string<char>,_basic_value<type_config>_>::value,_const_cxx::remove_cvref_t<basic_string<char,_char_traits<char>,_allocator<char>_>_>_&>
  pbVar4;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *v;
  integer_type *piVar5;
  TimeRepresentation<count_time<9,_long>_> TVar6;
  floating_type *pfVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  value *in_RDX;
  value *element;
  char *extraout_RDX;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *peVar10;
  double dVar11;
  string_view timeString;
  string_view timeString_00;
  value emptyVal;
  enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> val;
  size_t in_stack_fffffffffffffdd8;
  char *in_stack_fffffffffffffde0;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  string local_1e0;
  undefined1 local_1c0 [72];
  region local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vStack_110;
  basic_value<toml::type_config> local_f8;
  
  if (timeElement->type_ - 2 < 9) {
    peVar10 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              (ulong)defaultUnits;
    switch((uint)timeElement->type_) {
    case 2:
      piVar5 = toml::basic_value<toml::type_config>::as_integer(timeElement);
      TVar2.internalTimeCode = count_time<9,_long>::fromCount(*piVar5,defaultUnits);
      return (Time)TVar2.internalTimeCode;
    case 3:
      TVar6.internalTimeCode = -0x7fffffffffffffff;
      pfVar7 = toml::basic_value<toml::type_config>::as_floating(timeElement);
      dVar11 = *pfVar7 * timeCountReverse[(int)defaultUnits];
      if (-9223372036.854765 < dVar11) {
        if (9223372036.854765 <= dVar11) {
          TVar6.internalTimeCode = 0x7fffffffffffffff;
        }
        else {
          TVar6.internalTimeCode =
               (baseType)
               (dVar11 * 1000000000.0 +
               *(double *)(&DAT_003dd040 + (ulong)(0.0 <= dVar11 * 1000000000.0) * 8));
        }
      }
      break;
    default:
      goto switchD_00363f5a_caseD_4;
    case 8:
      eVar3 = toml::get<std::chrono::duration<long,std::ratio<1l,1000000000l>>,toml::type_config>
                        (timeElement);
      return (Time)eVar3.__r;
    case 10:
      pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,char[5]>
                         (timeElement,(char (*) [5])0x4062a9,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          emptyString_abi_cxx11_);
      if (pbVar4->_M_string_length != 0) {
        unitString._M_str = in_stack_fffffffffffffde0;
        unitString._M_len = in_stack_fffffffffffffdd8;
        tVar1 = gmlc::utilities::timeUnitsFromString(unitString);
        peVar10 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)(ulong)tVar1;
      }
      pbVar4 = toml::find_or<std::__cxx11::string,toml::type_config,char[6]>
                         (timeElement,(char (*) [6])0x407ea8,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          emptyString_abi_cxx11_);
      if (pbVar4->_M_string_length != 0) {
        unitString_00._M_str = in_stack_fffffffffffffde0;
        unitString_00._M_len = in_stack_fffffffffffffdd8;
        tVar1 = gmlc::utilities::timeUnitsFromString(unitString_00);
        peVar10 = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                   *)(ulong)tVar1;
      }
      toml::basic_value<toml::type_config>::basic_value((basic_value<toml::type_config> *)local_1c0)
      ;
      v = toml::find_or<toml::type_config,char[6]>
                    (timeElement,(char (*) [6])0x404c29,(basic_value<toml::type_config> *)local_1c0)
      ;
      toml::basic_value<toml::type_config>::basic_value(&local_f8,v);
      TVar6.internalTimeCode = -0x7fffffffffffffff;
      if (local_f8.type_ != empty) {
        if (local_f8.type_ == floating) {
          pfVar7 = toml::basic_value<toml::type_config>::as_floating(&local_f8);
          dVar11 = *pfVar7 * timeCountReverse[(int)(time_units)peVar10];
          if (-9223372036.854765 < dVar11) {
            if (9223372036.854765 <= dVar11) {
              TVar6.internalTimeCode = 0x7fffffffffffffff;
            }
            else {
              TVar6.internalTimeCode =
                   (baseType)
                   (dVar11 * 1000000000.0 +
                   *(double *)(&DAT_003dd040 + (ulong)(0.0 <= dVar11 * 1000000000.0) * 8));
            }
          }
        }
        else if (local_f8.type_ == integer) {
          piVar5 = toml::basic_value<toml::type_config>::as_integer(&local_f8);
          TVar6.internalTimeCode = count_time<9,_long>::fromCount(*piVar5,(time_units)peVar10);
          v = peVar10;
        }
        else {
          tomlAsString_abi_cxx11_(&local_1e0,(fileops *)&local_f8,element);
          pbVar8 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &local_1e0," ");
          local_210._16_8_ = (pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._16_8_ == paVar9) {
            local_1f0._M_allocated_capacity = paVar9->_M_allocated_capacity;
            local_1f0._8_8_ = *(undefined8 *)((long)&pbVar8->field_2 + 8);
            local_210._16_8_ = &local_1f0;
          }
          else {
            local_1f0._M_allocated_capacity = paVar9->_M_allocated_capacity;
          }
          local_210._24_8_ = pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          pbVar8 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (local_210 + 0x10),(pbVar4->_M_dataplus)._M_p,pbVar4->_M_string_length
                             );
          v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              (pbVar8->_M_dataplus)._M_p;
          paVar9 = &pbVar8->field_2;
          if (v == (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                    *)paVar9) {
            local_210._0_8_ = paVar9->_M_allocated_capacity;
            local_210._8_8_ = *(value_type_conflict4 *)((long)&pbVar8->field_2 + 8);
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)local_210;
          }
          else {
            local_210._0_8_ = paVar9->_M_allocated_capacity;
          }
          this = (utilities *)pbVar8->_M_string_length;
          (pbVar8->_M_dataplus)._M_p = (pointer)paVar9;
          pbVar8->_M_string_length = 0;
          (pbVar8->field_2)._M_local_buf[0] = '\0';
          timeString_00._M_str = (char *)this;
          timeString_00._M_len = (size_t)v;
          peVar10 = v;
          TVar6 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                            (this,timeString_00);
          if (peVar10 !=
              (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_> *)
              local_210) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_210._0_8_ + 1);
            operator_delete(peVar10,(ulong)v);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_210._16_8_ != &local_1f0) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_1f0._M_allocated_capacity + 1);
            operator_delete((void *)local_210._16_8_,(ulong)v);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
            v = (enable_if_t<detail::is_type_config<type_config>::value,_basic_value<type_config>_>
                 *)(local_1e0.field_2._M_allocated_capacity + 1);
            operator_delete(local_1e0._M_dataplus._M_p,(ulong)v);
          }
        }
      }
      toml::basic_value<toml::type_config>::cleanup(&local_f8,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_f8.comments_);
      toml::detail::region::~region(&local_f8.region_);
      toml::basic_value<toml::type_config>::cleanup
                ((basic_value<toml::type_config> *)local_1c0,(EVP_PKEY_CTX *)v);
      CLI::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&vStack_110);
      toml::detail::region::~region(&local_178);
    }
  }
  else {
switchD_00363f5a_caseD_4:
    tomlAsString_abi_cxx11_((string *)local_1c0,(fileops *)timeElement,in_RDX);
    timeString._M_str = extraout_RDX;
    timeString._M_len = local_1c0._0_8_;
    TVar6 = gmlc::utilities::loadTimeFromString<TimeRepresentation<count_time<9,long>>>
                      ((utilities *)local_1c0._8_8_,timeString);
    if ((undefined1 *)local_1c0._0_8_ != local_1c0 + 0x10) {
      operator_delete((void *)local_1c0._0_8_,local_1c0._16_8_ + 1);
    }
  }
  return (Time)TVar6.internalTimeCode;
}

Assistant:

helics::Time loadTomlTime(const toml::value& timeElement, time_units defaultUnits)
{
    if (timeElement.is_table()) {
        const auto& unit = toml::find_or<std::string>(timeElement, "unit", emptyString);
        if (!unit.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(unit);
        }
        const auto& units = toml::find_or<std::string>(timeElement, "units", emptyString);
        if (!units.empty()) {
            defaultUnits = gmlc::utilities::timeUnitsFromString(units);
        }
        const toml::value emptyVal;
        auto val = toml::find_or(timeElement, "value", emptyVal);
        if (!val.is_empty()) {
            if (val.is_integer()) {
                return {val.as_integer(), defaultUnits};
            }
            if (val.is_floating()) {
                return {val.as_floating() * toSecondMultiplier(defaultUnits)};
            }
            return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(val) + " " +
                                                                     units);
        }
    } else if (timeElement.is_integer()) {
        return {timeElement.as_integer(), defaultUnits};
    } else if (timeElement.is_floating()) {
        return {timeElement.as_floating() * toSecondMultiplier(defaultUnits)};
    } else if (timeElement.is_local_time()) {
        return {toml::get<std::chrono::nanoseconds>(timeElement)};
    } else {
        return gmlc::utilities::loadTimeFromString<helics::Time>(tomlAsString(timeElement));
    }
    return helics::Time::minVal();
}